

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

void __thiscall r_exec::Group::_update_visibility(Group *this,GroupState *state,View *view)

{
  bool bVar1;
  mapped_type *pmVar2;
  _Hashtable<r_exec::Group_*,_std::pair<r_exec::Group_*const,_bool>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<r_exec::Group_*>,_std::hash<r_exec::Group_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  float fVar3;
  Group *local_40;
  double local_38;
  double local_30;
  float local_28;
  float local_24;
  
  local_24 = View::get_vis(view);
  local_28 = get_vis_thr(this);
  local_30 = View::update_vis(view);
  fVar3 = get_vis_thr(this);
  local_38 = (double)fVar3;
  bVar1 = View::get_cov(view);
  local_40 = this;
  if ((state->was_c_active == true) && (state->was_c_salient == true)) {
    if ((state->is_c_active != true) || (state->is_c_salient == false)) {
      this_00 = (_Hashtable<r_exec::Group_*,_std::pair<r_exec::Group_*const,_bool>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<r_exec::Group_*>,_std::hash<r_exec::Group_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)((view->super_View).object.object + 0x3b);
LAB_00182215:
      std::
      _Hashtable<r_exec::Group_*,_std::pair<r_exec::Group_*const,_bool>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<r_exec::Group_*>,_std::hash<r_exec::Group_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(this_00);
      return;
    }
    if (local_28 < local_24) {
      this_00 = (_Hashtable<r_exec::Group_*,_std::pair<r_exec::Group_*const,_bool>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<r_exec::Group_*>,_std::hash<r_exec::Group_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)((view->super_View).object.object + 0x3b);
      if (local_30 <= local_38) goto LAB_00182215;
      goto LAB_001821fa;
    }
    if (local_30 <= local_38) {
      return;
    }
  }
  else {
    if (state->is_c_active != true) {
      return;
    }
    if (local_30 <= local_38) {
      return;
    }
    if (state->is_c_salient == false) {
      return;
    }
  }
  this_00 = (_Hashtable<r_exec::Group_*,_std::pair<r_exec::Group_*const,_bool>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<r_exec::Group_*>,_std::hash<r_exec::Group_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)((view->super_View).object.object + 0x3b);
LAB_001821fa:
  pmVar2 = std::__detail::
           _Map_base<r_exec::Group_*,_std::pair<r_exec::Group_*const,_bool>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<r_exec::Group_*>,_std::hash<r_exec::Group_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<r_exec::Group_*,_std::pair<r_exec::Group_*const,_bool>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<r_exec::Group_*>,_std::hash<r_exec::Group_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_40);
  *pmVar2 = bVar1;
  return;
}

Assistant:

void Group::_update_visibility(GroupState *state, View *view)
{
    bool view_was_visible = view->get_vis() > get_vis_thr();
    bool view_is_visible = view->update_vis() > get_vis_thr();
    bool cov = view->get_cov();

    // update viewing groups.
    if (state->was_c_active && state->was_c_salient) {
        if (!state->is_c_active || !state->is_c_salient) { // group is not c-active and c-salient anymore: unregister as a viewing group.
            ((Group *)view->object)->viewing_groups.erase(this);
        } else { // group remains c-active and c-salient.
            if (!view_was_visible) {
                if (view_is_visible) { // newly visible view.
                    ((Group *)view->object)->viewing_groups[this] = cov;
                }
            } else {
                if (!view_is_visible) { // the view is no longer visible.
                    ((Group *)view->object)->viewing_groups.erase(this);
                } else { // the view is still visible, cov might have changed.
                    ((Group *)view->object)->viewing_groups[this] = cov;
                }
            }
        }
    } else if (state->is_c_active && state->is_c_salient) { // group becomes c-active and c-salient.
        if (view_is_visible) { // update viewing groups for any visible group.
            ((Group *)view->object)->viewing_groups[this] = cov;
        }
    }
}